

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O0

void __thiscall
spvtools::opt::Instruction::SetOperand(Instruction *this,uint32_t index,OperandData *data)

{
  uint32_t uVar1;
  size_type sVar2;
  reference pvVar3;
  OperandData *data_local;
  uint32_t index_local;
  Instruction *this_local;
  
  sVar2 = std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::size
                    (&this->operands_);
  if (sVar2 <= index) {
    __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                  ,0x2b8,
                  "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)");
  }
  uVar1 = TypeResultIdCount(this);
  if (index < uVar1) {
    __assert_fail("index >= TypeResultIdCount() && \"operand is not a in-operand\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                  ,0x2b9,
                  "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)");
  }
  pvVar3 = std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::operator[]
                     (&this->operands_,(ulong)index);
  utils::SmallVector<unsigned_int,_2UL>::operator=(&pvVar3->words,data);
  return;
}

Assistant:

inline void Instruction::SetOperand(uint32_t index,
                                    Operand::OperandData&& data) {
  assert(index < operands_.size() && "operand index out of bound");
  assert(index >= TypeResultIdCount() && "operand is not a in-operand");
  operands_[index].words = std::move(data);
}